

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6522Implementation.hpp
# Opt level: O0

ssize_t __thiscall
MOS::MOS6522::
MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)2>::VIAPortHandler>
::read(MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)2>::VIAPortHandler>
       *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  undefined7 uVar5;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  byte bVar6;
  int address_local;
  MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)2>::VIAPortHandler>
  *this_local;
  
  uVar3 = __fd & 0xf;
  access(this,(char *)(ulong)uVar3,(int)__buf);
  lVar4 = (ulong)uVar3 - 0xf;
  if ((ulong)uVar3 < 0xf || lVar4 == 0) {
    uVar5 = (undefined7)((ulong)this >> 8);
    switch(uVar3) {
    case 0:
      (this->super_MOS6522Storage).registers_.interrupt_flags =
           (this->super_MOS6522Storage).registers_.interrupt_flags & 0xe7;
      reevaluate_interrupts(this);
      this_local._7_1_ =
           get_port_input(this,B,(this->super_MOS6522Storage).registers_.data_direction[1],
                          (this->super_MOS6522Storage).registers_.output[1],
                          (this->super_MOS6522Storage).registers_.auxiliary_control & 0x80);
      lVar4 = CONCAT71(extraout_var,this_local._7_1_);
      break;
    default:
      (this->super_MOS6522Storage).registers_.interrupt_flags =
           (this->super_MOS6522Storage).registers_.interrupt_flags & 0xfc;
      reevaluate_interrupts(this);
      this_local._7_1_ =
           get_port_input(this,A,(this->super_MOS6522Storage).registers_.data_direction[0],
                          (this->super_MOS6522Storage).registers_.output[0],'\0');
      lVar4 = CONCAT71(extraout_var_00,this_local._7_1_);
      break;
    case 2:
      this_local._7_1_ = (this->super_MOS6522Storage).registers_.data_direction[1];
      lVar4 = CONCAT71(uVar5,this_local._7_1_);
      break;
    case 3:
      this_local._7_1_ = (this->super_MOS6522Storage).registers_.data_direction[0];
      lVar4 = CONCAT71(uVar5,this_local._7_1_);
      break;
    case 4:
      (this->super_MOS6522Storage).registers_.interrupt_flags =
           (this->super_MOS6522Storage).registers_.interrupt_flags & 0xbf;
      reevaluate_interrupts(this);
      lVar4 = 0;
      this_local._7_1_ = (byte)(this->super_MOS6522Storage).registers_.timer[0];
      break;
    case 5:
      lVar4 = 0;
      this_local._7_1_ = (byte)((this->super_MOS6522Storage).registers_.timer[0] >> 8);
      break;
    case 6:
      lVar4 = 0;
      this_local._7_1_ = (byte)(this->super_MOS6522Storage).registers_.timer_latch[0];
      break;
    case 7:
      lVar4 = 0;
      this_local._7_1_ = (byte)((this->super_MOS6522Storage).registers_.timer_latch[0] >> 8);
      break;
    case 8:
      (this->super_MOS6522Storage).registers_.interrupt_flags =
           (this->super_MOS6522Storage).registers_.interrupt_flags & 0xdf;
      reevaluate_interrupts(this);
      lVar4 = 0;
      this_local._7_1_ = (byte)(this->super_MOS6522Storage).registers_.timer[1];
      break;
    case 9:
      lVar4 = 0;
      this_local._7_1_ = (byte)((this->super_MOS6522Storage).registers_.timer[1] >> 8);
      break;
    case 10:
      (this->super_MOS6522Storage).shift_bits_remaining_ = 8;
      (this->super_MOS6522Storage).registers_.interrupt_flags =
           (this->super_MOS6522Storage).registers_.interrupt_flags & 0xfb;
      reevaluate_interrupts(this);
      this_local._7_1_ = (this->super_MOS6522Storage).registers_.shift;
      lVar4 = CONCAT71(uVar5,this_local._7_1_);
      break;
    case 0xb:
      this_local._7_1_ = (this->super_MOS6522Storage).registers_.auxiliary_control;
      lVar4 = CONCAT71(uVar5,this_local._7_1_);
      break;
    case 0xc:
      this_local._7_1_ = (this->super_MOS6522Storage).registers_.peripheral_control;
      lVar4 = CONCAT71(uVar5,this_local._7_1_);
      break;
    case 0xd:
      bVar1 = (this->super_MOS6522Storage).registers_.interrupt_flags;
      bVar2 = get_interrupt_line(this);
      bVar6 = 0;
      if (bVar2) {
        bVar6 = 0x80;
      }
      this_local._7_1_ = bVar1 | bVar6;
      lVar4 = 0;
      break;
    case 0xe:
      this_local._7_1_ = (this->super_MOS6522Storage).registers_.interrupt_enable | 0x80;
      lVar4 = 0;
    }
  }
  else {
    this_local._7_1_ = 0xff;
  }
  return CONCAT71((int7)((ulong)lVar4 >> 8),this_local._7_1_);
}

Assistant:

uint8_t MOS6522<T>::read(int address) {
	address &= 0xf;
	access(address);
	switch(address) {
		case 0x0:	// Read Port B ('IRB').
			registers_.interrupt_flags &= ~(InterruptFlag::CB1ActiveEdge | InterruptFlag::CB2ActiveEdge);
			reevaluate_interrupts();
		return get_port_input(Port::B, registers_.data_direction[1], registers_.output[1], registers_.auxiliary_control & 0x80);
		case 0xf:
		case 0x1:	// Read Port A ('IRA').
			registers_.interrupt_flags &= ~(InterruptFlag::CA1ActiveEdge | InterruptFlag::CA2ActiveEdge);
			reevaluate_interrupts();
		return get_port_input(Port::A, registers_.data_direction[0], registers_.output[0], 0);

		case 0x2:	return registers_.data_direction[1];	// Port B direction ('DDRB').
		case 0x3:	return registers_.data_direction[0];	// Port A direction ('DDRA').

		// Timer 1
		case 0x4:	// Timer 1 low-order latches ('T1L-L').
			registers_.interrupt_flags &= ~InterruptFlag::Timer1;
			reevaluate_interrupts();
		return registers_.timer[0] & 0x00ff;
		case 0x5:	return registers_.timer[0] >> 8;			// Timer 1 high-order counter ('T1C-H')
		case 0x6:	return registers_.timer_latch[0] & 0x00ff;	// Timer 1 low-order latches ('T1L-L').
		case 0x7:	return registers_.timer_latch[0] >> 8;		// Timer 1 high-order latches ('T1L-H').

		// Timer 2
		case 0x8:	// Timer 2 low-order counter ('T2C-L').
			registers_.interrupt_flags &= ~InterruptFlag::Timer2;
			reevaluate_interrupts();
		return registers_.timer[1] & 0x00ff;
		case 0x9:	return registers_.timer[1] >> 8;	// Timer 2 high-order counter ('T2C-H').

		case 0xa:	// Shift register ('SR').
			shift_bits_remaining_ = 8;
			registers_.interrupt_flags &= ~InterruptFlag::ShiftRegister;
			reevaluate_interrupts();
		return registers_.shift;

		case 0xb:	return registers_.auxiliary_control;	// Auxiliary control ('ACR').
		case 0xc:	return registers_.peripheral_control;	// Peripheral control ('PCR').

		case 0xd:	return registers_.interrupt_flags | (get_interrupt_line() ? 0x80 : 0x00);	// Interrupt flag register ('IFR').
		case 0xe:	return registers_.interrupt_enable | 0x80;									// Interrupt enable register ('IER').
	}

	return 0xff;
}